

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::CustomModel::SharedDtor(CustomModel *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 != (undefined8 *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/CustomModel.pb.cc"
               ,0x1ff);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_49,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->classname_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->description_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  return;
}

Assistant:

inline void CustomModel::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  classname_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  description_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
}